

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_AllocAndInit
               (CLzmaEnc *p,UInt32 keepWindowSize,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  uint local_34;
  int __result__;
  UInt32 i;
  ISzAlloc *allocBig_local;
  ISzAlloc *alloc_local;
  UInt32 keepWindowSize_local;
  CLzmaEnc *p_local;
  
  for (local_34 = 0; (local_34 < 0x1f && ((uint)(1 << ((byte)local_34 & 0x1f)) < p->dictSize));
      local_34 = local_34 + 1) {
  }
  p->distTableSize = local_34 << 1;
  p->finished = 0;
  p->result = 0;
  p_local._4_4_ = LzmaEnc_Alloc(p,keepWindowSize,alloc,allocBig);
  if (p_local._4_4_ == 0) {
    LzmaEnc_Init(p);
    LzmaEnc_InitPrices(p);
    p->nowPos64 = 0;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static SRes LzmaEnc_AllocAndInit(CLzmaEnc* p, UInt32 keepWindowSize, ISzAlloc* alloc, ISzAlloc* allocBig) {
  UInt32 i;
  for (i = 0; i < (UInt32)kDicLogSizeMaxCompress; i++)
    if (p->dictSize <= ((UInt32)1 << i))
      break;
  p->distTableSize = i * 2;

  p->finished = False;
  p->result = SZ_OK;
  RINOK(LzmaEnc_Alloc(p, keepWindowSize, alloc, allocBig));
  LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  p->nowPos64 = 0;
  return SZ_OK;
}